

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::PointCase::iterate(PointCase *this)

{
  size_type *psVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  size_t **ppsVar18;
  bool bVar19;
  int iVar20;
  long *plVar21;
  undefined8 *puVar22;
  pointer pVVar23;
  ulong *puVar24;
  char *description;
  IterateResult IVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  string iterationDescription;
  ScopedLogSection section;
  undefined1 local_268 [32];
  undefined1 local_248 [24];
  long lStack_230;
  float local_224;
  Surface local_220;
  long lStack_208;
  string local_200;
  ScopedLogSection local_1e0;
  RasterizationArguments local_1d8;
  undefined4 uStack_1c4;
  undefined1 local_1b8 [8];
  pointer pSStack_1b0;
  pointer local_1a8;
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  iVar20 = *(int *)&(this->super_BaseRenderingCase).field_0xc4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<((ostringstream *)local_1b8,iVar20 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar21 = (long *)std::__cxx11::string::replace((ulong)local_268,0,(char *)0x0,0x1bccacd);
  pVVar23 = (pointer)(plVar21 + 2);
  if ((pointer)*plVar21 == pVVar23) {
    local_248._16_8_ = *(undefined8 *)pVVar23->m_data;
    lStack_230 = plVar21[3];
    local_248._0_8_ = (pointer)(local_248 + 0x10);
  }
  else {
    local_248._16_8_ = *(undefined8 *)pVVar23->m_data;
    local_248._0_8_ = (pointer)*plVar21;
  }
  local_248._8_8_ = plVar21[1];
  *plVar21 = (long)pVVar23;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  plVar21 = (long *)std::__cxx11::string::append(local_248);
  ppsVar18 = (size_t **)&local_220.m_pixels.m_cap;
  puVar24 = (ulong *)(plVar21 + 2);
  if ((ulong *)*plVar21 == puVar24) {
    local_220.m_pixels.m_cap = *puVar24;
    lStack_208 = plVar21[3];
    local_220._0_8_ = ppsVar18;
  }
  else {
    local_220.m_pixels.m_cap = *puVar24;
    local_220._0_8_ = (ulong *)*plVar21;
  }
  local_220.m_pixels.m_ptr = (void *)plVar21[1];
  *plVar21 = (long)puVar24;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  uVar28 = CONCAT44(local_1d8.greenBits,local_1d8.redBits) + (long)local_220.m_pixels.m_ptr;
  uVar26 = 0xf;
  if ((size_t **)local_220._0_8_ != ppsVar18) {
    uVar26 = local_220.m_pixels.m_cap;
  }
  if (uVar26 < uVar28) {
    uVar26 = 0xf;
    if ((int *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples) != &local_1d8.blueBits) {
      uVar26 = CONCAT44(uStack_1c4,local_1d8.blueBits);
    }
    if (uVar28 <= uVar26) {
      puVar22 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,local_220._0_8_);
      goto LAB_0106e792;
    }
  }
  puVar22 = (undefined8 *)
            std::__cxx11::string::_M_append
                      ((char *)&local_220,
                       (ulong)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples));
LAB_0106e792:
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  psVar1 = puVar22 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar22 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200.field_2._8_8_ = puVar22[3];
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200._M_dataplus._M_p = (pointer)*puVar22;
  }
  local_200._M_string_length = puVar22[1];
  *puVar22 = psVar1;
  puVar22[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((int *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples) != &local_1d8.blueBits) {
    operator_delete((undefined1 *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples),
                    CONCAT44(uStack_1c4,local_1d8.blueBits) + 1);
  }
  if ((size_t **)local_220._0_8_ != ppsVar18) {
    operator_delete((void *)local_220._0_8_,local_220.m_pixels.m_cap + 1);
  }
  if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
    operator_delete((void *)local_248._0_8_,(ulong)((long)(float *)local_248._16_8_ + 1));
  }
  if ((pointer)local_268._0_8_ != (pointer)(local_268 + 0x10)) {
    operator_delete((void *)local_268._0_8_,(ulong)((long)((Vec4 *)local_268._16_8_)->m_data + 1));
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1e0,
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log,&local_200,&local_200);
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this);
  iVar20 = (this->super_BaseRenderingCase).m_renderSize;
  local_224 = extraout_XMM0_Da;
  tcu::Surface::Surface(&local_220,iVar20,iVar20);
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  local_268._16_8_ = (pointer)0x0;
  local_268._0_8_ = (pointer)0x0;
  local_268._8_8_ = (pointer)0x0;
  if (local_224 <= this->m_maxPointSize) {
    uVar14 = *(uint *)&(this->super_BaseRenderingCase).field_0xc4;
    uVar28 = (ulong)uVar14;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_248,6
              );
    if (uVar14 < 3) {
      fVar4 = *(float *)(&DAT_01bf0f84 + uVar28 * 4);
      fVar5 = *(float *)(&DAT_01bf0f90 + uVar28 * 4);
      fVar6 = *(float *)(&DAT_01bf0f9c + uVar28 * 4);
      fVar7 = *(float *)(&DAT_01bf0fa8 + uVar28 * 4);
      fVar8 = *(float *)(&DAT_01bf0fb4 + uVar28 * 4);
      fVar9 = *(float *)(&DAT_01bf0fc0 + uVar28 * 4);
      fVar10 = *(float *)(&DAT_01bf0fcc + uVar28 * 4);
      fVar11 = *(float *)(&DAT_01bf0fd8 + uVar28 * 4);
      fVar12 = *(float *)(&DAT_01bf0fe4 + uVar28 * 4);
      fVar13 = *(float *)(&DAT_01bf0ff0 + uVar28 * 4);
      *(float *)local_248._0_8_ = *(float *)(&DAT_01bf0f78 + uVar28 * 4);
      ((float *)local_248._0_8_)[1] = fVar4;
      ((float *)local_248._0_8_)[2] = 0.0;
      ((float *)local_248._0_8_)[3] = 1.0;
      ((pointer)(local_248._0_8_ + 0x10))->m_data[0] = fVar5;
      ((pointer)(local_248._0_8_ + 0x10))->m_data[1] = fVar6;
      ((pointer)(local_248._0_8_ + 0x10))->m_data[2] = 0.0;
      ((pointer)(local_248._0_8_ + 0x10))->m_data[3] = 1.0;
      ((pointer)(local_248._0_8_ + 0x20))->m_data[0] = fVar7;
      ((pointer)(local_248._0_8_ + 0x20))->m_data[1] = fVar8;
      ((pointer)(local_248._0_8_ + 0x20))->m_data[2] = 0.0;
      ((pointer)(local_248._0_8_ + 0x20))->m_data[3] = 1.0;
      ((pointer)(local_248._0_8_ + 0x30))->m_data[0] = fVar9;
      ((pointer)(local_248._0_8_ + 0x30))->m_data[1] = 0.2;
      ((pointer)(local_248._0_8_ + 0x30))->m_data[2] = 0.0;
      ((pointer)(local_248._0_8_ + 0x30))->m_data[3] = 1.0;
      ((pointer)(local_248._0_8_ + 0x40))->m_data[0] = fVar10;
      ((pointer)(local_248._0_8_ + 0x40))->m_data[1] = fVar11;
      ((pointer)(local_248._0_8_ + 0x40))->m_data[2] = 0.0;
      ((pointer)(local_248._0_8_ + 0x40))->m_data[3] = 1.0;
      ((pointer)(local_248._0_8_ + 0x50))->m_data[0] = fVar12;
      ((pointer)(local_248._0_8_ + 0x50))->m_data[1] = fVar13;
      ((pointer)(local_248._0_8_ + 0x50))->m_data[2] = 0.0;
      ((pointer)(local_248._0_8_ + 0x50))->m_data[3] = 1.0;
    }
    std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
    resize((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
            *)local_268,(long)(local_248._8_8_ - local_248._0_8_) >> 4);
    if (0 < (int)((ulong)(local_268._8_8_ - local_268._0_8_) >> 2) * 0x38e38e39) {
      lVar29 = 0;
      lVar30 = 0;
      lVar27 = 0;
      do {
        puVar2 = (undefined4 *)((long)(float *)local_248._0_8_ + lVar29);
        uVar15 = puVar2[1];
        uVar16 = puVar2[2];
        uVar17 = puVar2[3];
        puVar3 = (undefined4 *)((long)((Vec4 *)local_268._0_8_)->m_data + lVar30);
        *puVar3 = *puVar2;
        puVar3[1] = uVar15;
        puVar3[2] = uVar16;
        puVar3[3] = uVar17;
        (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[6])(this);
        *(undefined4 *)((long)((Vec4 *)(local_268._0_8_ + 0x10) + 1) + lVar30) = extraout_XMM0_Da_00
        ;
        lVar27 = lVar27 + 1;
        lVar30 = lVar30 + 0x24;
        lVar29 = lVar29 + 0x10;
      } while (lVar27 < (int)((ulong)(local_268._8_8_ - local_268._0_8_) >> 2) * 0x38e38e39);
    }
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,"Rendering ",10);
    std::ostream::_M_insert<unsigned_long>((ulong)&pSStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pSStack_1b0," point(s): (point size = ",0x19);
    (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6]
    )(this);
    std::ostream::_M_insert<double>((double)extraout_XMM0_Da_01);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
    std::ios_base::~ios_base(local_140);
    if (0 < (int)((ulong)(local_268._8_8_ - local_268._0_8_) >> 2) * 0x38e38e39) {
      lVar27 = 0;
      lVar29 = 0;
      do {
        local_1b8 = (undefined1  [8])
                    ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,"Point ",6);
        lVar29 = lVar29 + 1;
        std::ostream::operator<<((ostringstream *)&pSStack_1b0,(int)lVar29);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,":\t",2);
        tcu::operator<<((ostream *)&pSStack_1b0,
                        (Vector<float,_4> *)((long)((Vec4 *)local_268._0_8_)->m_data + lVar27));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
        std::ios_base::~ios_base(local_140);
        lVar27 = lVar27 + 0x24;
      } while (lVar29 < (int)((ulong)(local_268._8_8_ - local_268._0_8_) >> 2) * 0x38e38e39);
    }
    BaseRenderingCase::drawPrimitives
              (&this->super_BaseRenderingCase,&local_220,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_248,0
              );
    local_1d8.numSamples = (this->super_BaseRenderingCase).m_numSamples;
    local_1d8.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
    local_1d8.redBits = (this->super_BaseRenderingCase).m_pixelFormat.redBits;
    local_1d8.greenBits = (this->super_BaseRenderingCase).m_pixelFormat.greenBits;
    local_1d8.blueBits = (this->super_BaseRenderingCase).m_pixelFormat.blueBits;
    local_1b8 = (undefined1  [8])local_268._0_8_;
    pSStack_1b0 = (pointer)local_268._8_8_;
    local_1a8 = (pointer)local_268._16_8_;
    local_268._0_8_ = (pointer)0x0;
    local_268._8_8_ = (pointer)0x0;
    local_268._16_8_ = (pointer)0x0;
    bVar19 = tcu::verifyPointGroupRasterization
                       (&local_220,(PointSceneSpec *)local_1b8,&local_1d8,
                        ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx)->m_log);
    if (!bVar19) {
      this->m_allIterationsPassed = false;
    }
    if (local_1b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
    }
  }
  else {
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,"Point size ",0xb);
    std::ostream::_M_insert<double>((double)local_224);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pSStack_1b0," not supported, skipping iteration.",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
    std::ios_base::~ios_base(local_140);
  }
  iVar20 = *(int *)&(this->super_BaseRenderingCase).field_0xc4 + 1;
  *(int *)&(this->super_BaseRenderingCase).field_0xc4 = iVar20;
  IVar25 = CONTINUE;
  if (iVar20 == this->m_iterationCount) {
    description = "Incorrect rasterization";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar25 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  if ((pointer)local_268._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ - local_268._0_8_);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  tcu::Surface::~Surface(&local_220);
  tcu::TestLog::endSection(local_1e0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  return IVar25;
}

Assistant:

PointCase::IterateResult PointCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const float								pointSize				= getPointSize();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<PointSceneSpec::ScenePoint>	points;

	// supported?
	if (pointSize <= m_maxPointSize)
	{
		// gen data
		generatePoints(m_iteration, drawBuffer, points);

		// draw image
		drawPrimitives(resultImage, drawBuffer, GL_POINTS);

		// compare
		{
			bool					compareOk;
			RasterizationArguments	args;
			PointSceneSpec			scene;

			args.numSamples		= m_numSamples;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= getPixelFormat().redBits;
			args.greenBits		= getPixelFormat().greenBits;
			args.blueBits		= getPixelFormat().blueBits;

			scene.points.swap(points);

			compareOk = verifyPointGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

			if (!compareOk)
				m_allIterationsPassed = false;
		}
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Point size " << pointSize << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}